

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::truncate
          (ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this,char *__file,
          __off_t __length)

{
  OutputDirective *pOVar1;
  OutputDirective *pOVar2;
  String *pSVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pOVar1 = this->ptr;
  pOVar2 = this->pos;
  while (pOVar1 + (long)__file < pOVar2) {
    this->pos = pOVar2 + -1;
    if ((pOVar2[-1].dir.ptr.isSet == true) &&
       (pSVar3 = pOVar2[-1].dir.ptr.field_1.value.parts.ptr, pSVar3 != (String *)0x0)) {
      sVar4 = pOVar2[-1].dir.ptr.field_1.value.parts.size_;
      pOVar2[-1].dir.ptr.field_1.value.parts.ptr = (String *)0x0;
      pOVar2[-1].dir.ptr.field_1.value.parts.size_ = 0;
      pAVar5 = pOVar2[-1].dir.ptr.field_1.value.parts.disposer;
      (**pAVar5->_vptr_ArrayDisposer)
                (pAVar5,pSVar3,0x18,sVar4,sVar4,ArrayDisposer::Dispose_<kj::String,_false>::destruct
                );
    }
    pOVar2 = this->pos;
  }
  return (int)pOVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }